

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverPSOR.cpp
# Opt level: O1

double __thiscall chrono::ChSolverPSOR::Solve(ChSolverPSOR *this,ChSystemDescriptor *sysd)

{
  int *piVar1;
  double dVar2;
  undefined1 auVar3 [16];
  ChConstraint *pCVar4;
  ChVariables *this_00;
  ChConstraint *pCVar5;
  ChConstraint *pCVar6;
  bool bVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  pointer ppCVar14;
  pointer ppCVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  uint iternum;
  ulong uVar19;
  pointer ppCVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  double dVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  double old_lambda_friction [3];
  double gi_values [3];
  undefined1 local_118 [16];
  double local_108 [4];
  double local_e8;
  undefined8 uStack_e0;
  long local_d8;
  long lStack_d0;
  long local_c0;
  undefined8 uStack_b8;
  double local_a8 [4];
  undefined8 local_88;
  undefined8 uStack_80;
  double local_78;
  undefined8 uStack_70;
  ChVectorRef local_60;
  ChVectorRef local_48;
  
  (this->super_ChIterativeSolverVI).m_iterations = 0;
  this->maxviolation = 0.0;
  ppCVar15 = (sysd->vconstraints).
             super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((sysd->vconstraints).
      super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>._M_impl.
      super__Vector_impl_data._M_finish == ppCVar15) {
    uVar16 = 0;
  }
  else {
    uVar18 = 0;
    uVar19 = 1;
    do {
      (*ppCVar15[uVar18]->_vptr_ChConstraint[6])();
      ppCVar15 = (sysd->vconstraints).
                 super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      uVar16 = (long)(sysd->vconstraints).
                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar15 >> 3;
      bVar7 = uVar19 < uVar16;
      uVar18 = uVar19;
      uVar19 = (ulong)((int)uVar19 + 1);
    } while (bVar7);
  }
  if (uVar16 != 0) {
    iVar21 = 0;
    uVar18 = 1;
    ppCVar20 = ppCVar15;
    do {
      pCVar4 = *ppCVar20;
      iVar22 = (int)uVar18;
      if (pCVar4->mode == CONSTRAINT_FRIC) {
        local_a8[iVar21] = pCVar4->g_i;
        iVar21 = iVar21 + 1;
        if (iVar21 == 3) {
          dVar32 = (local_a8[0] + local_a8[1] + local_a8[2]) / 3.0;
          ppCVar15[iVar22 - 3]->g_i = dVar32;
          ppCVar15[iVar22 - 2]->g_i = dVar32;
          pCVar4->g_i = dVar32;
          iVar21 = 0;
        }
      }
      ppCVar20 = ppCVar20 + 1;
      bVar7 = uVar18 < uVar16;
      uVar18 = (ulong)(iVar22 + 1);
    } while (bVar7);
  }
  ppCVar14 = (sysd->vvariables).
             super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((sysd->vvariables).
      super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppCVar14) {
    uVar16 = 1;
    uVar18 = 0;
    do {
      uVar19 = uVar16;
      this_00 = ppCVar14[uVar18];
      if (this_00->disabled == false) {
        ChVariables::Get_qb(&local_48,this_00);
        ChVariables::Get_fb(&local_60,
                            (sysd->vvariables).
                            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar18]);
        local_c0 = 0;
        uStack_b8 = 0;
        local_d8 = local_60.
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   ._0_8_;
        lStack_d0 = local_60.
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                    ._8_8_;
        if ((long)local_60.
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                  ._8_8_ < 0 &&
            local_60.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._0_8_ != 0) {
          __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                        ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                        "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
                       );
        }
        (*this_00->_vptr_ChVariables[4])(this_00,&local_48,&local_d8);
        if (local_c0 != 0) {
          free(*(void **)(local_c0 + -8));
        }
      }
      ppCVar14 = (sysd->vvariables).
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      uVar16 = (ulong)((int)uVar19 + 1);
      uVar18 = uVar19;
    } while (uVar19 < (ulong)((long)(sysd->vvariables).
                                    super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar14 >> 3
                             ));
  }
  ppCVar15 = (sysd->vconstraints).
             super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppCVar20 = (sysd->vconstraints).
             super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_warm_start == false) {
    lVar17 = (long)ppCVar20 - (long)ppCVar15;
    if (lVar17 != 0) {
      uVar16 = 0;
      do {
        ppCVar15[uVar16]->l_i = 0.0;
        uVar16 = uVar16 + 1;
      } while ((uVar16 & 0xffffffff) < (ulong)(lVar17 >> 3));
    }
  }
  else if (ppCVar20 != ppCVar15) {
    uVar16 = 0;
    uVar18 = 1;
    do {
      pCVar4 = ppCVar15[uVar16];
      if (pCVar4->active == true) {
        (*pCVar4->_vptr_ChConstraint[8])(pCVar4->l_i);
      }
      ppCVar15 = (sysd->vconstraints).
                 super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      bVar7 = uVar18 < (ulong)((long)(sysd->vconstraints).
                                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar15 >>
                              3);
      uVar16 = uVar18;
      uVar18 = (ulong)((int)uVar18 + 1);
    } while (bVar7);
  }
  if (0 < (this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_max_iterations) {
    iternum = 0;
    local_88 = 0x7fffffffffffffff;
    uStack_80 = 0x7fffffffffffffff;
    do {
      this->maxviolation = 0.0;
      ppCVar15 = (sysd->vconstraints).
                 super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      auVar31 = ZEXT864(0) << 0x40;
      local_118._0_8_ = 0.0;
      if ((sysd->vconstraints).
          super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
          _M_impl.super__Vector_impl_data._M_finish != ppCVar15) {
        uVar16 = 0;
        local_118 = ZEXT816(0);
        uVar23 = 1;
        iVar21 = 0;
        do {
          dVar32 = auVar31._0_8_;
          if (ppCVar15[uVar16]->active == true) {
            (*ppCVar15[uVar16]->_vptr_ChConstraint[7])();
            pCVar4 = (sysd->vconstraints).
                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16];
            auVar27._8_8_ = 0;
            auVar27._0_8_ = pCVar4->cfm_i;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = pCVar4->l_i;
            auVar33._8_8_ = 0;
            auVar33._0_8_ = dVar32 + pCVar4->b_i;
            auVar3 = vfmadd132sd_fma(auVar27,auVar33,auVar3);
            auVar27 = auVar3;
            (*pCVar4->_vptr_ChConstraint[0xc])();
            ppCVar15 = (sysd->vconstraints).
                       super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            pCVar4 = ppCVar15[uVar16];
            auVar24._8_8_ = 0x8000000000000000;
            auVar24._0_8_ = 0x8000000000000000;
            auVar24 = vxorpd_avx512vl(auVar3,auVar24);
            dVar32 = pCVar4->l_i;
            dVar26 = ((this->super_ChIterativeSolverVI).m_omega / pCVar4->g_i) * auVar24._0_8_ +
                     dVar32;
            if (pCVar4->mode == CONSTRAINT_FRIC) {
              local_108[iVar21] = dVar32;
              pCVar4->l_i = dVar26;
              iVar22 = iVar21 + 1;
              auVar34._8_8_ = 0x7fffffffffffffff;
              auVar34._0_8_ = 0x7fffffffffffffff;
              auVar24 = vandpd_avx(auVar3,auVar34);
              uVar8 = vcmpsd_avx512f(ZEXT816(0),auVar3,1);
              auVar25._8_8_ = auVar24._8_8_;
              auVar25._0_8_ = (ulong)(iVar21 == 0) * (ulong)!(bool)((byte)uVar8 & 1) * auVar24._0_8_
              ;
              iVar21 = iVar22;
              if (iVar22 == 3) {
                (*ppCVar15[uVar23 - 3]->_vptr_ChConstraint[0xb])();
                ppCVar15 = (sysd->vconstraints).
                           super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                pCVar4 = ppCVar15[uVar23 - 3];
                local_78 = pCVar4->l_i;
                auVar28._8_8_ = 0;
                auVar28._0_8_ = local_78;
                pCVar5 = ppCVar15[uVar23 - 2];
                local_e8 = pCVar5->l_i;
                auVar35._8_8_ = 0;
                auVar35._0_8_ = local_e8;
                pCVar6 = ppCVar15[uVar16];
                dVar32 = pCVar6->l_i;
                auVar39._8_8_ = 0;
                auVar39._0_8_ = dVar32;
                dVar26 = (this->super_ChIterativeSolverVI).m_shlambda;
                auVar42._8_8_ = 0;
                auVar42._0_8_ = dVar26;
                if ((dVar26 != 1.0) || (NAN(dVar26))) {
                  dVar26 = 1.0 - dVar26;
                  auVar44._8_8_ = 0;
                  auVar44._0_8_ = dVar26 * local_108[0];
                  auVar3 = vfmadd213sd_fma(auVar28,auVar42,auVar44);
                  local_78 = auVar3._0_8_;
                  auVar45._8_8_ = 0;
                  auVar45._0_8_ = dVar26 * local_108[1];
                  auVar3 = vfmadd213sd_fma(auVar35,auVar42,auVar45);
                  auVar43._8_8_ = 0;
                  auVar43._0_8_ = dVar26 * local_108[2];
                  auVar24 = vfmadd213sd_fma(auVar39,auVar42,auVar43);
                  pCVar4->l_i = local_78;
                  local_e8 = auVar3._0_8_;
                  pCVar5->l_i = local_e8;
                  dVar32 = auVar24._0_8_;
                  pCVar6->l_i = dVar32;
                }
                local_78 = local_78 - local_108[0];
                local_e8 = local_e8 - local_108[1];
                uStack_e0 = 0;
                dVar32 = dVar32 - local_108[2];
                uStack_70 = 0;
                (*pCVar4->_vptr_ChConstraint[8])();
                (*(sysd->vconstraints).
                  super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar23 - 2]->_vptr_ChConstraint[8])
                          (local_e8);
                (*(sysd->vconstraints).
                  super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar16]->_vptr_ChConstraint[8])(dVar32);
                iVar21 = 0;
                if ((this->super_ChIterativeSolverVI).record_violation_history == true) {
                  auVar12._8_8_ = uStack_80;
                  auVar12._0_8_ = local_88;
                  auVar13._8_8_ = uStack_70;
                  auVar13._0_8_ = local_78;
                  auVar3 = vandpd_avx(auVar12,auVar13);
                  auVar24 = vmaxsd_avx(local_118,auVar3);
                  auVar11._8_8_ = uStack_e0;
                  auVar11._0_8_ = local_e8;
                  auVar3 = vandpd_avx(auVar12,auVar11);
                  auVar24 = vmaxsd_avx(auVar24,auVar3);
                  auVar9._8_8_ = 0;
                  auVar9._0_8_ = dVar32;
                  auVar3 = vandpd_avx(auVar12,auVar9);
                  local_118 = vmaxsd_avx(auVar24,auVar3);
                }
              }
            }
            else {
              pCVar4->l_i = dVar26;
              (*pCVar4->_vptr_ChConstraint[0xb])();
              pCVar4 = (sysd->vconstraints).
                       super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar16];
              dVar26 = pCVar4->l_i;
              auVar29._8_8_ = 0;
              auVar29._0_8_ = dVar26;
              dVar2 = (this->super_ChIterativeSolverVI).m_shlambda;
              auVar36._8_8_ = 0;
              auVar36._0_8_ = dVar2;
              if ((dVar2 != 1.0) || (NAN(dVar2))) {
                auVar40._8_8_ = 0;
                auVar40._0_8_ = dVar32 * (1.0 - dVar2);
                auVar3 = vfmadd213sd_fma(auVar29,auVar36,auVar40);
                dVar26 = auVar3._0_8_;
                pCVar4->l_i = dVar26;
              }
              auVar37._8_8_ = 0x7fffffffffffffff;
              auVar37._0_8_ = 0x7fffffffffffffff;
              auVar25 = vandpd_avx(auVar37,auVar27);
              (*pCVar4->_vptr_ChConstraint[8])();
              if ((this->super_ChIterativeSolverVI).record_violation_history == true) {
                auVar41._8_8_ = 0x7fffffffffffffff;
                auVar41._0_8_ = 0x7fffffffffffffff;
                auVar10._8_8_ = 0;
                auVar10._0_8_ = dVar26 - dVar32;
                auVar3 = vandpd_avx(auVar41,auVar10);
                local_118 = vmaxsd_avx(local_118,auVar3);
              }
            }
            auVar38._8_8_ = 0x7fffffffffffffff;
            auVar38._0_8_ = 0x7fffffffffffffff;
            auVar30._8_8_ = 0;
            auVar30._0_8_ = this->maxviolation;
            auVar3 = vandpd_avx(auVar25,auVar38);
            auVar3 = vmaxsd_avx(auVar30,auVar3);
            auVar31 = ZEXT1664(auVar3);
            this->maxviolation = auVar3._0_8_;
          }
          uVar16 = (ulong)uVar23;
          ppCVar15 = (sysd->vconstraints).
                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          uVar23 = uVar23 + 1;
        } while (uVar16 < (ulong)((long)(sysd->vconstraints).
                                        super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar15
                                 >> 3));
      }
      if ((this->super_ChIterativeSolverVI).record_violation_history != false) {
        ChIterativeSolverVI::AtIterationEnd
                  (&this->super_ChIterativeSolverVI,this->maxviolation,(double)local_118._0_8_,
                   iternum);
      }
      piVar1 = &(this->super_ChIterativeSolverVI).m_iterations;
      *piVar1 = *piVar1 + 1;
    } while (((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_tolerance <=
              this->maxviolation) &&
            (iternum = iternum + 1,
            (int)iternum <
            (this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_max_iterations));
  }
  return this->maxviolation;
}

Assistant:

double ChSolverPSOR::Solve(ChSystemDescriptor& sysd) {
    std::vector<ChConstraint*>& mconstraints = sysd.GetConstraintsList();
    std::vector<ChVariables*>& mvariables = sysd.GetVariablesList();

    m_iterations = 0;
    maxviolation = 0;
    double maxdeltalambda = 0.;
    int i_friction_comp = 0;
    double old_lambda_friction[3];

    // 1)  Update auxiliary data in all constraints before starting,
    //     that is: g_i=[Cq_i]*[invM_i]*[Cq_i]' and  [Eq_i]=[invM_i]*[Cq_i]'
    for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
        mconstraints[ic]->Update_auxiliary();

    // Average all g_i for the triplet of contact constraints n,u,v.
    //
    int j_friction_comp = 0;
    double gi_values[3];
    for (unsigned int ic = 0; ic < mconstraints.size(); ic++) {
        if (mconstraints[ic]->GetMode() == CONSTRAINT_FRIC) {
            gi_values[j_friction_comp] = mconstraints[ic]->Get_g_i();
            j_friction_comp++;
            if (j_friction_comp == 3) {
                double average_g_i = (gi_values[0] + gi_values[1] + gi_values[2]) / 3.0;
                mconstraints[ic - 2]->Set_g_i(average_g_i);
                mconstraints[ic - 1]->Set_g_i(average_g_i);
                mconstraints[ic - 0]->Set_g_i(average_g_i);
                j_friction_comp = 0;
            }
        }
    }

    // 2)  Compute, for all items with variables, the initial guess for
    //     still unconstrained system:

    for (unsigned int iv = 0; iv < mvariables.size(); iv++) {
        if (mvariables[iv]->IsActive())
            mvariables[iv]->Compute_invMb_v(mvariables[iv]->Get_qb(), mvariables[iv]->Get_fb());  // q = [M]'*fb
    }

    // 3)  For all items with variables, add the effect of initial (guessed)
    //     lagrangian reactions of constraints, if a warm start is desired.
    //     Otherwise, if no warm start, simply resets initial lagrangians to zero.
    if (m_warm_start) {
        for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
            if (mconstraints[ic]->IsActive())
                mconstraints[ic]->Increment_q(mconstraints[ic]->Get_l_i());
    } else {
        for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
            mconstraints[ic]->Set_l_i(0.);
    }

    // 4)  Perform the iteration loops
    //

    for (int iter = 0; iter < m_max_iterations; iter++) {
        // The iteration on all constraints
        //

        maxviolation = 0;
        maxdeltalambda = 0;
        i_friction_comp = 0;

        for (unsigned int ic = 0; ic < mconstraints.size(); ic++) {
            // skip computations if constraint not active.
            if (mconstraints[ic]->IsActive()) {
                // compute residual  c_i = [Cq_i]*q + b_i + cfm_i*l_i
                double mresidual = mconstraints[ic]->Compute_Cq_q() + mconstraints[ic]->Get_b_i() +
                                   mconstraints[ic]->Get_cfm_i() * mconstraints[ic]->Get_l_i();

                // true constraint violation may be different from 'mresidual' (ex:clamped if unilateral)
                double candidate_violation = fabs(mconstraints[ic]->Violation(mresidual));

                // compute:  delta_lambda = -(omega/g_i) * ([Cq_i]*q + b_i + cfm_i*l_i )
                double deltal = (m_omega / mconstraints[ic]->Get_g_i()) * (-mresidual);

                if (mconstraints[ic]->GetMode() == CONSTRAINT_FRIC) {
                    candidate_violation = 0;

                    // update:   lambda += delta_lambda;
                    old_lambda_friction[i_friction_comp] = mconstraints[ic]->Get_l_i();
                    mconstraints[ic]->Set_l_i(old_lambda_friction[i_friction_comp] + deltal);
                    i_friction_comp++;

                    if (i_friction_comp == 1)
                        candidate_violation = fabs(ChMin(0.0, mresidual));

                    if (i_friction_comp == 3) {
                        mconstraints[ic - 2]->Project();  // the N normal component will take care of N,U,V
                        double new_lambda_0 = mconstraints[ic - 2]->Get_l_i();
                        double new_lambda_1 = mconstraints[ic - 1]->Get_l_i();
                        double new_lambda_2 = mconstraints[ic - 0]->Get_l_i();
                        // Apply the smoothing: lambda= sharpness*lambda_new_projected + (1-sharpness)*lambda_old
                        if (m_shlambda != 1.0) {
                            new_lambda_0 = m_shlambda * new_lambda_0 + (1.0 - m_shlambda) * old_lambda_friction[0];
                            new_lambda_1 = m_shlambda * new_lambda_1 + (1.0 - m_shlambda) * old_lambda_friction[1];
                            new_lambda_2 = m_shlambda * new_lambda_2 + (1.0 - m_shlambda) * old_lambda_friction[2];
                            mconstraints[ic - 2]->Set_l_i(new_lambda_0);
                            mconstraints[ic - 1]->Set_l_i(new_lambda_1);
                            mconstraints[ic - 0]->Set_l_i(new_lambda_2);
                        }
                        double true_delta_0 = new_lambda_0 - old_lambda_friction[0];
                        double true_delta_1 = new_lambda_1 - old_lambda_friction[1];
                        double true_delta_2 = new_lambda_2 - old_lambda_friction[2];
                        mconstraints[ic - 2]->Increment_q(true_delta_0);
                        mconstraints[ic - 1]->Increment_q(true_delta_1);
                        mconstraints[ic - 0]->Increment_q(true_delta_2);

                        if (this->record_violation_history) {
                            maxdeltalambda = ChMax(maxdeltalambda, fabs(true_delta_0));
                            maxdeltalambda = ChMax(maxdeltalambda, fabs(true_delta_1));
                            maxdeltalambda = ChMax(maxdeltalambda, fabs(true_delta_2));
                        }
                        i_friction_comp = 0;
                    }
                } else {
                    // update:   lambda += delta_lambda;
                    double old_lambda = mconstraints[ic]->Get_l_i();
                    mconstraints[ic]->Set_l_i(old_lambda + deltal);

                    // If new lagrangian multiplier does not satisfy inequalities, project
                    // it into an admissible orthant (or, in general, onto an admissible set)
                    mconstraints[ic]->Project();

                    // After projection, the lambda may have changed a bit..
                    double new_lambda = mconstraints[ic]->Get_l_i();

                    // Apply the smoothing: lambda= sharpness*lambda_new_projected + (1-sharpness)*lambda_old
                    if (m_shlambda != 1.0) {
                        new_lambda = m_shlambda * new_lambda + (1.0 - m_shlambda) * old_lambda;
                        mconstraints[ic]->Set_l_i(new_lambda);
                    }

                    double true_delta = new_lambda - old_lambda;

                    // For all items with variables, add the effect of incremented
                    // (and projected) lagrangian reactions:
                    mconstraints[ic]->Increment_q(true_delta);

                    if (this->record_violation_history)
                        maxdeltalambda = ChMax(maxdeltalambda, fabs(true_delta));
                }

                maxviolation = ChMax(maxviolation, fabs(candidate_violation));

            }  // end IsActive()

        }  // end loop on constraints

        // For recording into violation history, if debugging
        if (this->record_violation_history)
            AtIterationEnd(maxviolation, maxdeltalambda, iter);

        m_iterations++;

        // Terminate the loop if violation in constraints has been successfully limited.
        if (maxviolation < m_tolerance)
            break;

    }  // end iteration loop

    return maxviolation;
}